

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall google::protobuf::io::CodedInputStream::Refresh(CodedInputStream *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  LogMessage *pLVar4;
  undefined1 auVar5 [16];
  LogMessageFatal local_88 [23];
  Voidify local_71;
  string *local_70;
  string *absl_log_internal_check_op_result_1;
  void *pvStack_60;
  int buffer_size;
  void *void_buffer;
  int current_position;
  undefined1 local_48 [16];
  LogMessageFatal local_38 [23];
  Voidify local_21;
  string *local_20;
  string *absl_log_internal_check_op_result;
  CodedInputStream *this_local;
  
  absl_log_internal_check_op_result = (string *)this;
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  iVar3 = BufferSize(this);
  iVar3 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar3);
  local_20 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                       (iVar2,iVar3,"0 == BufferSize()");
  if (local_20 != (string *)0x0) {
    local_48 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,0x2a1,local_48._0_8_,local_48._8_8_);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar4);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  if (((*(int *)(this + 0x2c) < 1) && (*(int *)(this + 0x1c) < 1)) &&
     (*(int *)(this + 0x18) != *(int *)(this + 0x28))) {
    bVar1 = anon_unknown_1::NextNonEmpty
                      (*(ZeroCopyInputStream **)(this + 0x10),&stack0xffffffffffffffa0,
                       (int *)((long)&absl_log_internal_check_op_result_1 + 4));
    if (bVar1) {
      *(void **)this = pvStack_60;
      *(long *)(this + 8) = *(long *)this + (long)absl_log_internal_check_op_result_1._4_4_;
      iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue
                        (absl_log_internal_check_op_result_1._4_4_);
      iVar3 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
      local_70 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_
                           (iVar2,iVar3,"buffer_size >= 0");
      if (local_70 != (string *)0x0) {
        auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
                   ,0x2b6,auVar5._0_8_,auVar5._8_8_);
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_88);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_71,pLVar4);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_88);
      }
      if (0x7fffffff - absl_log_internal_check_op_result_1._4_4_ < *(int *)(this + 0x18)) {
        *(int *)(this + 0x1c) =
             *(int *)(this + 0x18) - (0x7fffffff - absl_log_internal_check_op_result_1._4_4_);
        *(long *)(this + 8) = *(long *)(this + 8) - (long)*(int *)(this + 0x1c);
        *(undefined4 *)(this + 0x18) = 0x7fffffff;
      }
      else {
        *(int *)(this + 0x18) = absl_log_internal_check_op_result_1._4_4_ + *(int *)(this + 0x18);
      }
      RecomputeBufferLimits(this);
      this_local._7_1_ = true;
    }
    else {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      this_local._7_1_ = false;
    }
  }
  else {
    void_buffer._0_4_ = *(int *)(this + 0x18) - *(int *)(this + 0x2c);
    if ((*(int *)(this + 0x30) <= (int)void_buffer) &&
       (*(int *)(this + 0x30) != *(int *)(this + 0x28))) {
      PrintTotalBytesLimitError(this);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CodedInputStream::Refresh() {
  ABSL_DCHECK_EQ(0, BufferSize());

  if (buffer_size_after_limit_ > 0 || overflow_bytes_ > 0 ||
      total_bytes_read_ == current_limit_) {
    // We've hit a limit.  Stop.
    int current_position = total_bytes_read_ - buffer_size_after_limit_;

    if (current_position >= total_bytes_limit_ &&
        total_bytes_limit_ != current_limit_) {
      // Hit total_bytes_limit_.
      PrintTotalBytesLimitError();
    }

    return false;
  }

  const void* void_buffer;
  int buffer_size;
  if (NextNonEmpty(input_, &void_buffer, &buffer_size)) {
    buffer_ = reinterpret_cast<const uint8_t*>(void_buffer);
    buffer_end_ = buffer_ + buffer_size;
    ABSL_CHECK_GE(buffer_size, 0);

    if (total_bytes_read_ <= INT_MAX - buffer_size) {
      total_bytes_read_ += buffer_size;
    } else {
      // Overflow.  Reset buffer_end_ to not include the bytes beyond INT_MAX.
      // We can't get that far anyway, because total_bytes_limit_ is guaranteed
      // to be less than it.  We need to keep track of the number of bytes
      // we discarded, though, so that we can call input_->BackUp() to back
      // up over them on destruction.

      // The following line is equivalent to:
      //   overflow_bytes_ = total_bytes_read_ + buffer_size - INT_MAX;
      // except that it avoids overflows.  Signed integer overflow has
      // undefined results according to the C standard.
      overflow_bytes_ = total_bytes_read_ - (INT_MAX - buffer_size);
      buffer_end_ -= overflow_bytes_;
      total_bytes_read_ = INT_MAX;
    }

    RecomputeBufferLimits();
    return true;
  } else {
    buffer_ = NULL;
    buffer_end_ = NULL;
    return false;
  }
}